

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::SimpleTimeZone::getTimeZoneRules
          (SimpleTimeZone *this,InitialTimeZoneRule **initial,TimeZoneRule **trsrules,
          int32_t *trscount,UErrorCode *status)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    checkTransitionRules(this,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      *initial = this->initialRule;
      if (this->stdRule == (AnnualTimeZoneRule *)0x0) {
        uVar2 = 0;
      }
      else {
        iVar1 = *trscount;
        if (0 < iVar1) {
          *trsrules = &this->stdRule->super_TimeZoneRule;
        }
        uVar2 = (uint)(0 < iVar1);
        if ((int)uVar2 < iVar1) {
          uVar3 = (ulong)uVar2;
          uVar2 = uVar2 + 1;
          trsrules[uVar3] = &this->dstRule->super_TimeZoneRule;
        }
      }
      *trscount = uVar2;
    }
    return;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }